

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::TestCallback::toApp(TestCallback *this,Message *message,SessionID *param_2)

{
  FieldMap *this_00;
  bool bVar1;
  int iVar2;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var3;
  DoNotSend *this_01;
  MsgType msgType;
  PossDupFlag possDupFlag;
  undefined1 local_e8 [96];
  FieldBase local_88;
  
  if (this->checkForDoNotSend != 0) {
    FIX::StringField::StringField((StringField *)&local_88,0x3a);
    local_88._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00324a98;
    bVar1 = FIX::FieldMap::getFieldIfSet((FieldMap *)message,&local_88);
    if (bVar1) {
      iVar2 = std::__cxx11::string::compare((char *)&local_88.m_string);
      if (iVar2 == 0) {
        this_01 = (DoNotSend *)__cxa_allocate_exception(0x50);
        local_e8._0_8_ = local_e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"");
        FIX::DoNotSend::DoNotSend(this_01,(string *)local_e8);
        __cxa_throw(this_01,&FIX::DoNotSend::typeinfo,FIX::Exception::~Exception);
      }
    }
    FIX::FieldBase::~FieldBase(&local_88);
  }
  FIX::BoolField::BoolField((BoolField *)&local_88,0x2b,false);
  local_88._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00326c78;
  this_00 = (FieldMap *)(message + 0x70);
  _Var3 = FIX::FieldMap::
          lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                    (this_00,*(FieldBase **)(message + 0x78),*(FieldBase **)(message + 0x80),
                     local_88.m_tag);
  if (_Var3._M_current != *(FieldBase **)(message + 0x80)) {
    FIX::FieldMap::getField(this_00,&local_88);
  }
  bVar1 = FIX::BoolField::getValue((BoolField *)&local_88);
  if (bVar1) {
    this->resent = this->resent + 1;
    FIX::FieldMap::operator=((FieldMap *)&this->lastResent,(FieldMap *)message);
    FIX::FieldMap::operator=((FieldMap *)&this->field_0xe0,this_00);
    FIX::FieldMap::operator=((FieldMap *)&this->field_0x150,(FieldMap *)(message + 0xe0));
    *(undefined8 *)&this->field_0x1c0 = *(undefined8 *)(message + 0x150);
  }
  FIX::StringField::StringField((StringField *)local_e8,0x23);
  local_e8._0_8_ = &PTR__FieldBase_00324788;
  FIX::FieldMap::getField(this_00,(FieldBase *)local_e8);
  if (*(char *)local_e8._16_8_ == 'j') {
    this->toBusinessMessageReject = this->toBusinessMessageReject + 1;
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_e8);
  FIX::FieldBase::~FieldBase(&local_88);
  return;
}

Assistant:

EXCEPT( DoNotSend )
  {
    if(checkForDoNotSend) {
      FIX::Text text;
      if(message.getFieldIfSet(text) && text == "DoNotSend") {
        throw DoNotSend();
      }
    }

    PossDupFlag possDupFlag(false);
    if( message.getHeader().isSetField(possDupFlag) )
      message.getHeader().getField( possDupFlag );
    if( possDupFlag ) 
    {
      resent++;
      lastResent = message;
    }

    MsgType msgType;
    message.getHeader().getField( msgType );
    switch ( msgType.getValue() [ 0 ] )
    {
      case 'j':
      toBusinessMessageReject++; break;
    }
  }